

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

IOTHUB_PROCESS_ITEM_RESULT
IoTHubTransport_MQTT_Common_ProcessItem
          (TRANSPORT_LL_HANDLE handle,IOTHUB_IDENTITY_TYPE item_type,
          IOTHUB_IDENTITY_INFO *iothub_item)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  MQTT_DEVICE_TWIN_ITEM *mqtt_info_00;
  MQTT_DEVICE_TWIN_ITEM *mqtt_info;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  LOGGER_LOG l;
  IOTHUB_PROCESS_ITEM_RESULT result;
  IOTHUB_IDENTITY_INFO *iothub_item_local;
  IOTHUB_IDENTITY_TYPE item_type_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if ((handle == (TRANSPORT_LL_HANDLE)0x0) || (iothub_item == (IOTHUB_IDENTITY_INFO *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_ProcessItem",0xe05,1,
                "Invalid handle parameter iothub_item=%p",iothub_item);
    }
    l._4_4_ = IOTHUB_PROCESS_ERROR;
  }
  else if (*(int *)((long)handle + 0xf0) == 0x30) {
    if ((item_type == IOTHUB_TYPE_DEVICE_TWIN) && ((*(byte *)((long)handle + 0x8f) & 1) != 0)) {
      mqtt_info_00 = createDeviceTwinMsg((MQTTTRANSPORT_HANDLE_DATA *)handle,REPORTED_STATE,
                                         iothub_item->device_twin->item_id);
      if (mqtt_info_00 == (MQTT_DEVICE_TWIN_ITEM *)0x0) {
        l._4_4_ = IOTHUB_PROCESS_ERROR;
      }
      else {
        DList_InsertTailList((PDLIST_ENTRY)((long)handle + 0xd0),&mqtt_info_00->entry);
        iVar1 = publishDeviceTwinMsg
                          ((MQTTTRANSPORT_HANDLE_DATA *)handle,iothub_item->device_twin,mqtt_info_00
                          );
        if (iVar1 != 0) {
          DList_RemoveEntryList(&mqtt_info_00->entry);
          free(mqtt_info_00);
        }
        l._4_4_ = (IOTHUB_PROCESS_ITEM_RESULT)(iVar1 != 0);
      }
    }
    else {
      l._4_4_ = IOTHUB_PROCESS_CONTINUE;
    }
  }
  else {
    l._4_4_ = IOTHUB_PROCESS_NOT_CONNECTED;
  }
  return l._4_4_;
}

Assistant:

IOTHUB_PROCESS_ITEM_RESULT IoTHubTransport_MQTT_Common_ProcessItem(TRANSPORT_LL_HANDLE handle, IOTHUB_IDENTITY_TYPE item_type, IOTHUB_IDENTITY_INFO* iothub_item)
{
    IOTHUB_PROCESS_ITEM_RESULT result;
    if (handle == NULL || iothub_item == NULL)
    {
        LogError("Invalid handle parameter iothub_item=%p", iothub_item);
        result = IOTHUB_PROCESS_ERROR;
    }
    else
    {
        PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;

        if (transport_data->currPacketState == PUBLISH_TYPE)
        {
            // Ensure the reported property suback has been received
            if (item_type == IOTHUB_TYPE_DEVICE_TWIN && transport_data->twin_resp_sub_recv)
            {
                MQTT_DEVICE_TWIN_ITEM* mqtt_info = createDeviceTwinMsg(transport_data, REPORTED_STATE, iothub_item->device_twin->item_id);
                if (mqtt_info == NULL)
                {
                    result = IOTHUB_PROCESS_ERROR;
                }
                else
                {
                    DList_InsertTailList(&transport_data->ack_waiting_queue, &mqtt_info->entry);

                    if (publishDeviceTwinMsg(transport_data, iothub_item->device_twin, mqtt_info) != 0)
                    {
                        DList_RemoveEntryList(&mqtt_info->entry);

                        free(mqtt_info);
                        result = IOTHUB_PROCESS_ERROR;
                    }
                    else
                    {
                        result = IOTHUB_PROCESS_OK;
                    }
                }
            }
            else
            {
                result = IOTHUB_PROCESS_CONTINUE;
            }
        }
        else
        {
            result = IOTHUB_PROCESS_NOT_CONNECTED;
        }
    }
    return result;
}